

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

qsizetype QLocaleData::findLocaleIndex(QLocaleId lid)

{
  QLocaleId localeId;
  QLocaleId localeId_00;
  undefined8 uVar1;
  QLocaleId localeId_01;
  QLocaleId QVar2;
  ulong uVar3;
  long lVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  QLocaleId *b;
  undefined1 **ptr;
  long in_FS_OFFSET;
  QLocaleId local_90;
  QLocaleId local_88;
  QLocaleId local_80;
  undefined1 local_78 [24];
  undefined1 *local_60;
  undefined1 *puStack_58;
  undefined1 *local_50;
  undefined1 *puStack_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = lid.language_id;
  uVar5 = lid.script_id;
  uVar6 = lid.territory_id;
  local_88.language_id = uVar7;
  local_88.script_id = uVar5;
  local_88.territory_id = uVar6;
  localeId_01 = QLocaleId::withLikelySubtagsAdded(&local_88);
  local_90._0_4_ = localeId_01._0_4_;
  local_90.territory_id = localeId_01.territory_id;
  uVar3 = findLocaleIndexById(localeId_01);
  if (-1 < (long)uVar3) goto LAB_003081aa;
  local_78._16_8_ = &local_60;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_60 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = 6;
  local_78._8_8_ = 0;
  QVLABase<QLocaleId>::emplace_back_impl<QLocaleId_const&>
            ((QVLABase<QLocaleId> *)local_78,6,(void *)local_78._16_8_,&local_90);
  ptr = (undefined1 **)local_78._16_8_;
  uVar1 = local_78._8_8_;
  QVar2.script_id = local_88.script_id;
  QVar2.language_id = local_88.language_id;
  QVar2.territory_id = local_88.territory_id;
  if (local_78._8_8_ != 0) {
    lVar4 = local_78._8_8_ * 6;
    do {
      if (((*(ushort *)(local_78._16_8_ + lVar4 + -6) == local_88.language_id) &&
          (local_88.script_id == *(ushort *)(local_78._16_8_ + lVar4 + -4))) &&
         (*(ushort *)(local_78._16_8_ + lVar4 + -2) == local_88.territory_id)) goto LAB_00308059;
      lVar4 = lVar4 + -6;
    } while (lVar4 != 0);
  }
  uVar3 = findLocaleIndexById(QVar2);
  if ((long)uVar3 < 0) {
    if (uVar1 == local_78._0_8_) {
      local_80.territory_id = local_88.territory_id;
      local_80._0_4_ = CONCAT22(local_88.script_id,local_88.language_id);
      QVLABase<QLocaleId>::emplace_back_impl<QLocaleId>
                ((QVLABase<QLocaleId> *)local_78,6,&local_60,&local_80);
    }
    else {
      QVLABase<QLocaleId>::emplace_back_impl<QLocaleId_const&>
                ((QVLABase<QLocaleId> *)local_78,6,&local_60,&local_88);
    }
LAB_00308059:
    ptr = (undefined1 **)local_78._16_8_;
    if (uVar6 == 0) {
LAB_00308169:
      if (uVar6 == 0 && uVar7 == 0 || uVar5 == 0) {
LAB_0030817c:
        uVar3 = (ulong)locale_index[(ulong)(uint6)localeId_01 & 0xffff];
      }
      else {
        local_88.script_id = 0;
        local_88.language_id = uVar7;
        local_88.territory_id = uVar6;
        QVar2 = QLocaleId::withLikelySubtagsAdded(&local_88);
        uVar1 = local_78._8_8_;
        local_90._0_4_ = QVar2._0_4_;
        local_90.territory_id = QVar2.territory_id;
        if (local_78._8_8_ != 0) {
          lVar4 = local_78._8_8_ * 6;
          do {
            if (((*(ushort *)((long)ptr + lVar4 + -6) == QVar2.language_id) &&
                ((uint)local_90._0_4_ >> 0x10 == (uint)*(ushort *)((long)ptr + lVar4 + -4))) &&
               (*(ushort *)((long)ptr + lVar4 + -2) == local_90.territory_id)) goto LAB_0030828f;
            lVar4 = lVar4 + -6;
          } while (lVar4 != 0);
        }
        uVar3 = findLocaleIndexById(QVar2);
        if ((long)uVar3 < 0) {
          if (uVar1 == local_78._0_8_) {
            local_80.territory_id = local_90.territory_id;
            local_80.language_id = local_90.language_id;
            local_80.script_id = local_90.script_id;
            QVLABase<QLocaleId>::emplace_back_impl<QLocaleId>
                      ((QVLABase<QLocaleId> *)local_78,6,&local_60,&local_80);
          }
          else {
            QVLABase<QLocaleId>::emplace_back_impl<QLocaleId_const&>
                      ((QVLABase<QLocaleId> *)local_78,6,&local_60,&local_90);
          }
LAB_0030828f:
          ptr = (undefined1 **)local_78._16_8_;
          localeId_00.script_id = local_88.script_id;
          localeId_00.language_id = local_88.language_id;
          localeId_00.territory_id = local_88.territory_id;
          if (local_78._8_8_ != 0) {
            lVar4 = local_78._8_8_ * 6;
            do {
              if (((*(ushort *)(local_78._16_8_ + lVar4 + -6) == local_88.language_id) &&
                  (local_88.script_id == *(ushort *)(local_78._16_8_ + lVar4 + -4))) &&
                 (*(ushort *)(local_78._16_8_ + lVar4 + -2) == local_88.territory_id))
              goto LAB_0030817c;
              lVar4 = lVar4 + -6;
            } while (lVar4 != 0);
          }
          uVar3 = findLocaleIndexById(localeId_00);
          if ((long)uVar3 < 0) {
            QVarLengthArray<QLocaleId,_6LL>::push_back
                      ((QVarLengthArray<QLocaleId,_6LL> *)local_78,&local_88);
            ptr = (undefined1 **)local_78._16_8_;
            goto LAB_0030817c;
          }
        }
      }
    }
    else {
      if (uVar7 == 0 && uVar5 == 0) goto LAB_0030817c;
      local_88.territory_id = 0;
      QVar2 = QLocaleId::withLikelySubtagsAdded(&local_88);
      local_90._0_4_ = QVar2._0_4_;
      local_90.territory_id = QVar2.territory_id;
      if (local_78._8_8_ != 0) {
        lVar4 = local_78._8_8_ * 6;
        do {
          if (((*(ushort *)((long)ptr + lVar4 + -6) == QVar2.language_id) &&
              ((uint)local_90._0_4_ >> 0x10 == (uint)*(ushort *)((long)ptr + lVar4 + -4))) &&
             (*(ushort *)((long)ptr + lVar4 + -2) == local_90.territory_id)) goto LAB_003080fb;
          lVar4 = lVar4 + -6;
        } while (lVar4 != 0);
      }
      uVar3 = findLocaleIndexById(QVar2);
      if ((long)uVar3 < 0) {
        QVarLengthArray<QLocaleId,_6LL>::push_back
                  ((QVarLengthArray<QLocaleId,_6LL> *)local_78,&local_90);
        ptr = (undefined1 **)local_78._16_8_;
LAB_003080fb:
        localeId.script_id = local_88.script_id;
        localeId.language_id = local_88.language_id;
        localeId.territory_id = local_88.territory_id;
        if (local_78._8_8_ != 0) {
          lVar4 = local_78._8_8_ * 6;
          do {
            if (((*(ushort *)((long)ptr + lVar4 + -6) == local_88.language_id) &&
                (local_88.script_id == *(ushort *)((long)ptr + lVar4 + -4))) &&
               (*(ushort *)((long)ptr + lVar4 + -2) == local_88.territory_id)) goto LAB_00308169;
            lVar4 = lVar4 + -6;
          } while (lVar4 != 0);
        }
        uVar3 = findLocaleIndexById(localeId);
        if ((long)uVar3 < 0) {
          QVarLengthArray<QLocaleId,_6LL>::push_back
                    ((QVarLengthArray<QLocaleId,_6LL> *)local_78,&local_88);
          ptr = (undefined1 **)local_78._16_8_;
          goto LAB_00308169;
        }
      }
    }
  }
  if (ptr != &local_60) {
    QtPrivate::sizedFree(ptr,local_78._0_8_ * 6);
  }
LAB_003081aa:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar3;
}

Assistant:

qsizetype QLocaleData::findLocaleIndex(QLocaleId lid) noexcept
{
    QLocaleId localeId = lid;
    QLocaleId likelyId = localeId.withLikelySubtagsAdded();
    const ushort fallback = likelyId.language_id;

    // Try a straight match with the likely data:
    qsizetype index = findLocaleIndexById(likelyId);
    if (index >= 0)
        return index;
    QVarLengthArray<QLocaleId, 6> tried;
    tried.push_back(likelyId);

#define CheckCandidate(id) do { \
        if (!tried.contains(id)) { \
            index = findLocaleIndexById(id); \
            if (index >= 0) \
                return index; \
            tried.push_back(id); \
        } \
    } while (false) // end CheckCandidate

    // No match; try again with raw data:
    CheckCandidate(localeId);

    // No match; try again with likely country for language_script
    if (lid.territory_id && (lid.language_id || lid.script_id)) {
        localeId.territory_id = 0;
        likelyId = localeId.withLikelySubtagsAdded();
        CheckCandidate(likelyId);

        // No match; try again with any country
        CheckCandidate(localeId);
    }

    // No match; try again with likely script for language_region
    if (lid.script_id && (lid.language_id || lid.territory_id)) {
        localeId = QLocaleId { lid.language_id, 0, lid.territory_id };
        likelyId = localeId.withLikelySubtagsAdded();
        CheckCandidate(likelyId);

        // No match; try again with any script
        CheckCandidate(localeId);
    }
#undef CheckCandidate

    // No match; return base index for initial likely language:
    return locale_index[fallback];
}